

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O2

int luaB_newproxy(lua_State *L)

{
  int iVar1;
  
  lua_settop(L,1);
  lua_newuserdata(L,0);
  iVar1 = lua_toboolean(L,1);
  if (iVar1 == 0) {
    return 1;
  }
  iVar1 = lua_type(L,1);
  if (iVar1 == 1) {
    lua_createtable(L,0,0);
    lua_pushvalue(L,-1);
    lua_pushboolean(L,1);
    lua_rawset(L,-0x2713);
    goto LAB_00116e86;
  }
  iVar1 = lua_getmetatable(L,1);
  if (iVar1 == 0) {
LAB_00116e69:
    luaL_argerror(L,1,"boolean or proxy expected");
  }
  else {
    lua_rawget(L,-0x2713);
    iVar1 = lua_toboolean(L,-1);
    lua_settop(L,-2);
    if (iVar1 == 0) goto LAB_00116e69;
  }
  lua_getmetatable(L,1);
LAB_00116e86:
  lua_setmetatable(L,2);
  return 1;
}

Assistant:

static int luaB_newproxy (lua_State *L) {
  lua_settop(L, 1);
  lua_newuserdata(L, 0);  /* create proxy */
  if (lua_toboolean(L, 1) == 0)
    return 1;  /* no metatable */
  else if (lua_isboolean(L, 1)) {
    lua_newtable(L);  /* create a new metatable `m' ... */
    lua_pushvalue(L, -1);  /* ... and mark `m' as a valid metatable */
    lua_pushboolean(L, 1);
    lua_rawset(L, lua_upvalueindex(1));  /* weaktable[m] = true */
  }
  else {
    int validproxy = 0;  /* to check if weaktable[metatable(u)] == true */
    if (lua_getmetatable(L, 1)) {
      lua_rawget(L, lua_upvalueindex(1));
      validproxy = lua_toboolean(L, -1);
      lua_pop(L, 1);  /* remove value */
    }
    luaL_argcheck(L, validproxy, 1, "boolean or proxy expected");
    lua_getmetatable(L, 1);  /* metatable is valid; get it */
  }
  lua_setmetatable(L, 2);
  return 1;
}